

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

ForStatement * __thiscall SQCompilation::SQParser::parseForStatement(SQParser *this)

{
  long lVar1;
  SQInteger SVar2;
  bool bVar3;
  Node *args;
  Expr *args_1;
  Expr *args_2;
  Statement *args_3;
  ForStatement *pFVar4;
  bool local_49;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  lVar1 = (this->_lex)._tokencolumn;
  SVar2 = (this->_lex)._tokenline;
  Lex(this);
  Expect(this,0x28);
  if (this->_token == 0x3b) {
    args = (Node *)0x0;
  }
  else if (this->_token == 0x11b) {
    args = (Node *)parseLocalDeclStatement(this);
  }
  else {
    args = &parseCommaExpr(this,SQE_REGULAR)->super_Node;
  }
  Expect(this,0x3b);
  if (this->_token == 0x3b) {
    args_1 = (Expr *)0x0;
  }
  else {
    args_1 = Expression(this,SQE_LOOP_CONDITION);
  }
  Expect(this,0x3b);
  if (this->_token == 0x29) {
    args_2 = (Expr *)0x0;
  }
  else {
    args_2 = parseCommaExpr(this,SQE_REGULAR);
  }
  Expect(this,0x29);
  checkBraceIndentationStyle(this);
  args_3 = IfLikeBlock(this,&local_49);
  bVar3 = IsEndOfStatement(this);
  if (!bVar3) {
    reportDiagnostic(this,0x38,"for loop body");
  }
  if ((((this->_token != 0) && (this->_token != 0x7d)) &&
      ((this->_lex)._tokenline != (long)(args_3->super_Node)._coordinates.lineEnd)) &&
     (lVar1 < (this->_lex)._tokencolumn)) {
    reportDiagnostic(this,0x68);
  }
  pFVar4 = newNode<SQCompilation::ForStatement,SQCompilation::Node*,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Statement*>
                     (this,args,args_1,args_2,args_3);
  (pFVar4->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart = (int)SVar2;
  (pFVar4->super_LoopStatement).super_Statement.super_Node._coordinates.columnStart = (int)lVar1;
  (pFVar4->super_LoopStatement).super_Statement.super_Node._coordinates.lineEnd =
       (int)(this->_lex)._currentline;
  (pFVar4->super_LoopStatement).super_Statement.super_Node._coordinates.columnEnd =
       (int)(this->_lex)._currentcolumn;
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return pFVar4;
}

Assistant:

ForStatement* SQParser::parseForStatement()
{
    NestingChecker nc(this);

    SQInteger l = line(), c = column();

    Consume(TK_FOR);

    Expect(_SC('('));

    Node *init = NULL;
    if (_token == TK_LOCAL)
        init = parseLocalDeclStatement();
    else if (_token != _SC(';')) {
        init = parseCommaExpr(SQE_REGULAR);
    }
    Expect(_SC(';'));

    Expr *cond = NULL;
    if(_token != _SC(';')) {
        cond = Expression(SQE_LOOP_CONDITION);
    }
    Expect(_SC(';'));

    Expr *mod = NULL;
    if(_token != _SC(')')) {
        mod = parseCommaExpr(SQE_REGULAR);
    }
    Expect(_SC(')'));

    bool wrapped = false;
    checkBraceIndentationStyle();
    Statement *body = IfLikeBlock(wrapped);

    if (!IsEndOfStatement()) {
      reportDiagnostic(DiagnosticsId::DI_STMT_SAME_LINE, "for loop body");
    }

    if (_token != SQUIRREL_EOB && _token != _SC('}')) {
      if (line() != body->lineEnd() && column() > c) {
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_FMT);
      }
    }

    return setCoordinates(newNode<ForStatement>(init, cond, mod, body), l, c);
}